

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O2

QString * LdConfigDirWrapper::translateGuardFlag(QString *__return_storage_ptr__,DWORD flags)

{
  char *ch;
  
  if ((flags >> 8 & 1) == 0) {
    if ((flags >> 9 & 1) == 0) {
      if ((flags >> 10 & 1) == 0) {
        if ((flags >> 0xb & 1) == 0) {
          if ((flags >> 0xc & 1) == 0) {
            if ((flags >> 0xd & 1) == 0) {
              if ((flags >> 0xe & 1) == 0) {
                if ((short)flags < 0) {
                  ch = "CF_ENABLE_EXPORT_SUPPRESSION";
                }
                else if ((flags >> 0x10 & 1) == 0) {
                  if ((flags >> 0x11 & 1) == 0) {
                    if ((flags >> 0x12 & 1) == 0) {
                      if ((flags >> 0x13 & 1) == 0) {
                        ch = "RETPOLINE_PRESENT";
                        if ((flags >> 0x14 & 1) == 0) {
                          ch = "";
                        }
                      }
                      else {
                        ch = "RF_STRICT";
                      }
                    }
                    else {
                      ch = "RF_ENABLE";
                    }
                  }
                  else {
                    ch = "RF_INSTRUMENTED";
                  }
                }
                else {
                  ch = "CF_LONGJUMP_TABLE_PRESENT";
                }
              }
              else {
                ch = "CF_EXPORT_SUPPRESSION_INFO_PRESENT";
              }
            }
            else {
              ch = "DELAYLOAD_IAT_IN_ITS_OWN_SECTION";
            }
          }
          else {
            ch = "PROTECT_DELAYLOAD_IAT";
          }
        }
        else {
          ch = "SECURITY_COOKIE_UNUSED";
        }
      }
      else {
        ch = "CF_FUNCTION_TABLE_PRESENT";
      }
    }
    else {
      ch = "CFW_INSTRUMENTED";
    }
  }
  else {
    ch = "CF_INSTRUMENTED";
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString LdConfigDirWrapper::translateGuardFlag(DWORD flags)
{
    if (flags & IMAGE_GUARD_CF_INSTRUMENTED) {
        return ("CF_INSTRUMENTED");
    }
    if (flags & IMAGE_GUARD_CFW_INSTRUMENTED) {
        return ("CFW_INSTRUMENTED");
    }
    if (flags & IMAGE_GUARD_CF_FUNCTION_TABLE_PRESENT) {
        return ("CF_FUNCTION_TABLE_PRESENT");
    } 
    if (flags & IMAGE_GUARD_SECURITY_COOKIE_UNUSED) {
        return ("SECURITY_COOKIE_UNUSED");
    } 
    if (flags & IMAGE_GUARD_PROTECT_DELAYLOAD_IAT) {
        return ("PROTECT_DELAYLOAD_IAT");
    } 
    if (flags & IMAGE_GUARD_DELAYLOAD_IAT_IN_ITS_OWN_SECTION) {
        return ("DELAYLOAD_IAT_IN_ITS_OWN_SECTION");
    } 
    if (flags & IMAGE_GUARD_CF_EXPORT_SUPPRESSION_INFO_PRESENT) {
        return ("CF_EXPORT_SUPPRESSION_INFO_PRESENT");
    }
    if (flags & IMAGE_GUARD_CF_ENABLE_EXPORT_SUPPRESSION) {
        return ("CF_ENABLE_EXPORT_SUPPRESSION");
    }
    if (flags & IMAGE_GUARD_CF_LONGJUMP_TABLE_PRESENT) {
        return ("CF_LONGJUMP_TABLE_PRESENT");
    }
    if (flags & IMAGE_GUARD_RF_INSTRUMENTED) {
        return ("RF_INSTRUMENTED");
    }
    if (flags & IMAGE_GUARD_RF_ENABLE) {
        return ("RF_ENABLE");
    }
    if (flags & IMAGE_GUARD_RF_STRICT) {
        return ("RF_STRICT");
    }
    if (flags & IMAGE_GUARD_RETPOLINE_PRESENT) {
        return ("RETPOLINE_PRESENT");
    }
    return "";
}